

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::setHandleUnknown
          (Result *__return_storage_ptr__,OneHotEncoder *this,MLHandleUnknown state)

{
  element_type *this_00;
  OneHotEncoder *this_01;
  OneHotEncoder *ohe;
  MLHandleUnknown state_local;
  OneHotEncoder *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_onehotencoder(this_00);
  Specification::OneHotEncoder::set_handleunknown(this_01,state);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setHandleUnknown(MLHandleUnknown state) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->set_handleunknown(static_cast<Specification::OneHotEncoder_HandleUnknown>(state));

        return Result();
    }